

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_mul_s390x(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t a_00;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong a_01;
  ulong uVar7;
  uint uVar8;
  int32_t zExp;
  bool bVar9;
  float128 fVar10;
  int32_t aExp;
  int32_t bExp;
  uint64_t aSig1;
  uint64_t more2;
  uint64_t z3;
  uint local_ac;
  float_status *local_a8;
  uint local_9c;
  ulong local_98;
  uint64_t local_90;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  ulong local_68;
  ulong local_60;
  uint64_t local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  uint64_t local_38;
  
  uVar3 = b.low;
  local_88 = a.low;
  local_80 = a.high & 0xffffffffffff;
  local_ac = a.high._6_2_ & 0x7fff;
  uVar7 = b.high & 0xffffffffffff;
  uVar8 = b.high._6_2_ & 0x7fff;
  uVar5 = b.high ^ a.high;
  local_9c = uVar8;
  local_90 = uVar3;
  local_60 = uVar7;
  if (local_ac == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_88 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar3 != 0) && uVar8 == 0x7fff)) {
LAB_00ac3bf9:
      fVar10 = propagateFloat128NaN(a,b,status);
      return fVar10;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar3 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_00ac3c4e:
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar7 = 0x7fff800000000000;
      goto LAB_00ac3c5c;
    }
  }
  else {
    if (uVar8 != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            local_88 == 0) goto LAB_00ac3de7;
        normalizeFloat128Subnormal(local_80,local_88,(int32_t *)&local_ac,&local_80,&local_88);
      }
      local_a8 = status;
      if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            uVar3 == 0) {
LAB_00ac3de7:
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar5 & 0x8000000000000000;
          return (float128)(auVar1 << 0x40);
        }
        normalizeFloat128Subnormal(uVar7,uVar3,(int32_t *)&local_9c,&local_60,&local_90);
        uVar7 = local_60;
        uVar3 = local_90;
        uVar8 = local_9c;
      }
      a_00 = local_88;
      local_68 = uVar5 >> 0x3f;
      local_98 = (ulong)local_ac;
      a_01 = local_80 | 0x1000000000000;
      uVar7 = uVar7 << 0x10 | uVar3 >> 0x30;
      local_70 = local_88;
      mul64To128(local_88,uVar3 << 0x10,&local_50,&local_58);
      mul64To128(a_00,uVar7,&local_38,&local_78);
      uVar4 = local_50 + local_78;
      uVar6 = local_38 + CARRY8(local_50,local_78);
      mul64To128(a_01,uVar7,&local_48,&local_40);
      bVar9 = CARRY8(uVar6,local_40);
      uVar6 = uVar6 + local_40;
      mul64To128(a_01,uVar3 << 0x10,&local_40,&local_78);
      uVar5 = local_40 + uVar6 + (ulong)CARRY8(uVar4,local_78);
      uVar7 = uVar5 + local_70;
      uVar3 = (ulong)(uVar5 < uVar6) + local_48 + a_01 + (ulong)bVar9 +
              (ulong)CARRY8(uVar5,local_70);
      uVar5 = (ulong)(local_58 != 0) | uVar4 + local_78;
      if (uVar3 >> 0x31 == 0) {
        zExp = uVar8 + (int)local_98 + -0x4000;
      }
      else {
        uVar4 = uVar3 << 0x3f;
        uVar3 = uVar3 >> 1;
        uVar5 = (ulong)(uVar5 != 0) | uVar7 << 0x3f;
        zExp = uVar8 + (int)local_98 + -0x3fff;
        uVar7 = uVar4 | uVar7 >> 1;
      }
      fVar10 = roundAndPackFloat128((flag)local_68,zExp,uVar3,uVar7,uVar5,local_a8);
      return fVar10;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar3 != 0) goto LAB_00ac3bf9;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_88 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_00ac3c4e;
  }
  uVar7 = uVar5 & 0x8000000000000000 | 0x7fff000000000000;
LAB_00ac3c5c:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  return (float128)(auVar2 << 0x40);
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}